

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes ReadUi32s(CSzData *sd2,UInt32 numItems,CSzBitUi32s *crcs,ISzAlloc *alloc)

{
  long lVar1;
  long lVar2;
  undefined8 *in_RCX;
  long *in_RDX;
  uint in_ESI;
  undefined8 *in_RDI;
  Byte *defs;
  UInt32 *vals;
  CSzData sd;
  UInt32 i;
  undefined4 *local_40;
  ulong local_38;
  uint local_2c;
  
  if (in_ESI == 0) {
    in_RDX[1] = 0;
  }
  else {
    lVar2 = (*(code *)*in_RCX)(in_RCX,(ulong)in_ESI << 2);
    in_RDX[1] = lVar2;
    if (lVar2 == 0) {
      return 2;
    }
  }
  local_40 = (undefined4 *)*in_RDI;
  local_38 = in_RDI[1];
  lVar2 = *in_RDX;
  lVar1 = in_RDX[1];
  local_2c = 0;
  do {
    if (in_ESI <= local_2c) {
      *in_RDI = local_40;
      in_RDI[1] = local_38;
      return 0;
    }
    if (((uint)*(byte *)(lVar2 + (ulong)(local_2c >> 3)) & 0x80 >> ((byte)local_2c & 7)) == 0) {
      *(undefined4 *)(lVar1 + (ulong)local_2c * 4) = 0;
    }
    else {
      if (local_38 < 4) {
        return 0x10;
      }
      *(undefined4 *)(lVar1 + (ulong)local_2c * 4) = *local_40;
      local_38 = local_38 - 4;
      local_40 = local_40 + 1;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static MY_NO_INLINE SRes ReadUi32s(CSzData *sd2, UInt32 numItems, CSzBitUi32s *crcs, ISzAlloc *alloc)
{
  UInt32 i;
  CSzData sd;
  UInt32 *vals;
  const Byte *defs;
  MY_ALLOC_ZE(UInt32, crcs->Vals, numItems, alloc);
  sd = *sd2;
  defs = crcs->Defs;
  vals = crcs->Vals;
  for (i = 0; i < numItems; i++)
    if (SzBitArray_Check(defs, i))
    {
      SZ_READ_32(vals[i]);
    }
    else
      vals[i] = 0;
  *sd2 = sd;
  return SZ_OK;
}